

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

bool chaiscript::Name_Validator::is_reserved_word<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  int iVar1;
  size_type sVar2;
  long lVar3;
  size_type sVar4;
  uint *puVar5;
  uint *puVar6;
  byte bVar7;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  uint local_68 [24];
  
  bVar7 = 0;
  if ((is_reserved_word<std::__cxx11::string>(std::__cxx11::string_const&)::words == '\0') &&
     (iVar1 = __cxa_guard_acquire(&is_reserved_word<std::__cxx11::string>(std::__cxx11::string_const&)
                                   ::words), iVar1 != 0)) {
    puVar5 = &DAT_003895e8;
    puVar6 = local_68;
    for (lVar3 = 0x18; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_Hashtable<unsigned_int_const*>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&is_reserved_word<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::words,local_68,&stack0xfffffffffffffff8,0,&local_69,&local_6a,&local_6b);
    __cxa_atexit(std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::~unordered_set,
                 &is_reserved_word<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::words,&__dso_handle);
    __cxa_guard_release(&is_reserved_word<std::__cxx11::string>(std::__cxx11::string_const&)::words)
    ;
  }
  if (s->_M_string_length == 0) {
    local_68[0] = 0x811c9dc5;
  }
  else {
    local_68[0] = 0x811c9dc5;
    sVar4 = 0;
    do {
      local_68[0] = ((int)(s->_M_dataplus)._M_p[sVar4] ^ local_68[0]) * 0x1000193;
      sVar4 = sVar4 + 1;
    } while (s->_M_string_length != sVar4);
  }
  sVar2 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&is_reserved_word<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::words._M_h,local_68);
  return sVar2 == 1;
}

Assistant:

static bool is_reserved_word(const T &s) noexcept {
      const static std::unordered_set<std::uint32_t>
          words{utility::hash("def"), utility::hash("fun"), utility::hash("while"), utility::hash("for"), utility::hash("if"), utility::hash("else"), utility::hash("&&"), utility::hash("||"), utility::hash(","), utility::hash("auto"), utility::hash("return"), utility::hash("break"), utility::hash("true"), utility::hash("false"), utility::hash("class"), utility::hash("attr"), utility::hash("var"), utility::hash("global"), utility::hash("GLOBAL"), utility::hash("_"), utility::hash("__LINE__"), utility::hash("__FILE__"), utility::hash("__FUNC__"), utility::hash("__CLASS__")};

      return words.count(utility::hash(s)) == 1;
    }